

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::LocalSingleStoreElim
          (LocalSingleStoreElimPass *this,Function *func)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var1;
  Instruction *var_inst;
  bool bVar2;
  bool bVar3;
  Instruction *inst;
  Instruction **ppIVar4;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((func->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  bVar3 = false;
  ppIVar4 = (Instruction **)
            ((long)_Var1._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20);
  while ((var_inst = *ppIVar4,
         var_inst !=
         (Instruction *)
         ((long)_Var1._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x18) &&
         (var_inst->opcode_ == OpVariable))) {
    bVar2 = ProcessVariable(this,var_inst);
    bVar3 = (bool)(bVar3 | bVar2);
    ppIVar4 = &(var_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return bVar3;
}

Assistant:

bool LocalSingleStoreElimPass::LocalSingleStoreElim(Function* func) {
  bool modified = false;

  // Check all function scope variables in |func|.
  BasicBlock* entry_block = &*func->begin();
  for (Instruction& inst : *entry_block) {
    if (inst.opcode() != spv::Op::OpVariable) {
      break;
    }

    modified |= ProcessVariable(&inst);
  }
  return modified;
}